

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O2

Uint32 __thiscall
Diligent::SerializedPipelineStateImpl::GetPatchedShaderCount
          (SerializedPipelineStateImpl *this,ARCHIVE_DEVICE_DATA_FLAGS DeviceType)

{
  DeviceType DVar1;
  uint uVar2;
  char (*in_R8) [68];
  string msg;
  
  if ((this->m_Status)._M_i != PIPELINE_STATE_STATUS_READY) {
    FormatString<char[17],char_const*,char[68]>
              (&msg,(Diligent *)"Pipeline state \'",(char (*) [17])&this->m_Desc,
               (char **)"\' is not ready. Use GetStatus() to check the pipeline state status.",in_R8
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetPatchedShaderCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1cc);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((DeviceType ^ DeviceType - ARCHIVE_DEVICE_DATA_FLAG_D3D11) <=
      DeviceType - ARCHIVE_DEVICE_DATA_FLAG_D3D11) {
    FormatString<char[41]>(&msg,(char (*) [41])"Only single device data flag is expected");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetPatchedShaderCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1cd);
    std::__cxx11::string::~string((string *)&msg);
  }
  DVar1 = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
  msg._M_dataplus._M_p =
       (pointer)(((long)(this->m_Data).Shaders._M_elems[DVar1].
                        super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_Data).Shaders._M_elems[DVar1].
                       super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg);
  return uVar2;
}

Assistant:

Uint32 DILIGENT_CALL_TYPE SerializedPipelineStateImpl::GetPatchedShaderCount(ARCHIVE_DEVICE_DATA_FLAGS DeviceType) const
{
    DEV_CHECK_ERR(m_Status.load() == PIPELINE_STATE_STATUS_READY, "Pipeline state '", m_Desc.Name, "' is not ready. Use GetStatus() to check the pipeline state status.");
    DEV_CHECK_ERR(IsPowerOfTwo(DeviceType), "Only single device data flag is expected");
    const auto  Type    = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
    const auto& Shaders = m_Data.Shaders[static_cast<size_t>(Type)];
    return StaticCast<Uint32>(Shaders.size());
}